

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O0

void __thiscall duel::initializeField_(duel *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  uint *puVar5;
  reference pvVar6;
  duel *this_local;
  
  bVar2 = std::stack<card,_std::deque<card,_std::allocator<card>_>_>::empty(&this->deck);
  if (bVar2) {
    this->duelEnd = true;
  }
  else {
    pvVar4 = std::stack<card,_std::deque<card,_std::allocator<card>_>_>::top(&this->deck);
    std::vector<card,std::allocator<card>>::emplace_back<card&>
              ((vector<card,std::allocator<card>> *)&(this->field1).field_,pvVar4);
    std::stack<card,_std::deque<card,_std::allocator<card>_>_>::pop(&this->deck);
    puVar5 = field::getPile(&this->field1);
    uVar1 = *puVar5;
    pvVar6 = std::vector<card,_std::allocator<card>_>::back(&(this->field1).field_);
    uVar3 = card::getValue(pvVar6);
    field::setPile(&this->field1,uVar1 + uVar3);
    pvVar4 = std::stack<card,_std::deque<card,_std::allocator<card>_>_>::top(&this->deck);
    std::vector<card,std::allocator<card>>::emplace_back<card&>
              ((vector<card,std::allocator<card>> *)&(this->field2).field_,pvVar4);
    std::stack<card,_std::deque<card,_std::allocator<card>_>_>::pop(&this->deck);
    puVar5 = field::getPile(&this->field2);
    uVar1 = *puVar5;
    pvVar6 = std::vector<card,_std::allocator<card>_>::back(&(this->field2).field_);
    uVar3 = card::getValue(pvVar6);
    field::setPile(&this->field2,uVar1 + uVar3);
    bVar2 = equalValue(this);
    if (bVar2) {
      resetField(this);
      initializeField_(this);
    }
  }
  return;
}

Assistant:

void duel::initializeField_() {
    // checks if deck empty, then tie
    if(deck.empty()) {
        duelEnd = true;
        return;
    }
    // puts a card from each deck onto the field
    field1.field_.emplace_back(deck.top());
    deck.pop();
    field1.setPile(field1.getPile()+field1.field_.back().getValue());
    field2.field_.emplace_back(deck.top());
    deck.pop();
    field2.setPile(field2.getPile()+field2.field_.back().getValue());
    // if piles are of equal value then reset field and draw again
    if(equalValue()) {
        resetField();
        initializeField_();
    }
}